

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O3

size_t mfwrite(void *ptr,size_t size,size_t nmemb,mFILE *mf)

{
  char *__ptr;
  size_t sVar1;
  ulong uVar2;
  size_t __n;
  bool bVar3;
  
  if ((mf->mode & 2U) == 0) {
LAB_0012f7e2:
    nmemb = 0;
  }
  else {
    if ((mf->mode & 4U) == 0) {
      sVar1 = mf->offset;
    }
    else {
      sVar1 = mf->size;
      mf->offset = sVar1;
    }
    __n = size * nmemb;
    uVar2 = mf->alloced;
    if (uVar2 < sVar1 + __n) {
      __ptr = mf->data;
      do {
        bVar3 = uVar2 == 0;
        uVar2 = uVar2 * 2;
        if (bVar3) {
          uVar2 = 0x400;
        }
        __ptr = (char *)realloc(__ptr,uVar2);
        if (__ptr == (char *)0x0) goto LAB_0012f7e2;
        mf->alloced = uVar2;
        mf->data = __ptr;
        sVar1 = mf->offset;
      } while (uVar2 < sVar1 + __n);
    }
    if (sVar1 < mf->flush_pos) {
      mf->flush_pos = sVar1;
    }
    memcpy(mf->data + sVar1,ptr,__n);
    uVar2 = __n + mf->offset;
    mf->offset = uVar2;
    if (mf->size < uVar2) {
      mf->size = uVar2;
    }
  }
  return nmemb;
}

Assistant:

size_t mfwrite(void *ptr, size_t size, size_t nmemb, mFILE *mf) {
    if (!(mf->mode & MF_WRITE))
	return 0;

    /* Append mode => forced all writes to end of file */
    if (mf->mode & MF_APPEND)
	mf->offset = mf->size;

    /* Make sure we have enough room */
    while (size * nmemb + mf->offset > mf->alloced) {
	size_t new_alloced = mf->alloced ? mf->alloced * 2 : 1024;
	void * new_data = realloc(mf->data, new_alloced);
	if (NULL == new_data) return 0;
	mf->alloced = new_alloced;
	mf->data    = new_data;
    }

    /* Record where we need to reflush from */
    if (mf->offset < mf->flush_pos)
	mf->flush_pos = mf->offset;

    /* Copy the data over */
    memcpy(&mf->data[mf->offset], ptr, size * nmemb);
    mf->offset += size * nmemb;
    if (mf->size < mf->offset)
	mf->size = mf->offset;

    return nmemb;
}